

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O3

int pztopology::TPZPrism::SideNodeLocId(int side,int node)

{
  ostream *poVar1;
  long *plVar2;
  char local_19;
  
  if (side < 6 && node == 0) {
    return side;
  }
  if (node < 2 && side - 6U < 9) {
    return SideNodes[side - 6U][node];
  }
  if (side == 0xf) {
    if (node < 3) {
      return FaceNodes[0][node];
    }
  }
  else {
    if (node < 4 && side - 0x10U < 3) {
      return FaceNodes[side - 0xf][node];
    }
    if (side != 0x13) {
      if (side == 0x14 && node < 6) {
        return node;
      }
      goto LAB_00daf45c;
    }
    if (node < 3) {
      return FaceNodes[4][node];
    }
  }
  if (node == 3) {
    return -1;
  }
LAB_00daf45c:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZPrism::SideNodeLocId inconsistent side or node ",0x32);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,side);
  local_19 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  plVar2 = (long *)std::ostream::operator<<(poVar1,node);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return -1;
}

Assistant:

int TPZPrism::SideNodeLocId(int side, int node)
	{
		if(side<6 && node == 0) return side;
		if(side>= 6 && side < 15 && node<2) return SideNodes[side-6][node];
		if(side==15) {
			if(node < 3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; //previsto para faces triangulares
		}
		if(side>15 && side <19 && node <4) return FaceNodes[side-15][node];
		if(side==19) {
			if(node<3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; // Previsto p/ faces triangulares
        }
		
		if(side==20 && node<6) return node;
		PZError << "TPZPrism::SideNodeLocId inconsistent side or node " << side << ' ' << node << endl;
		return -1;
	}